

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

int __thiscall deqp::gles31::Functional::DebugTests::init(DebugTests *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppTVar1;
  deUint32 *pdVar2;
  Context *pCVar3;
  deBool dVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  TestNode *pTVar8;
  LimitQueryCase *pLVar9;
  char *pcVar10;
  char *pcVar11;
  IsEnabledCase *pIVar12;
  PositiveIntegerCase *pPVar13;
  GroupStackDepthQueryCase *pGVar14;
  TestNode *pTVar15;
  TestNode *pTVar16;
  GroupCase *this_00;
  TestContext *this_01;
  CommandLine *this_02;
  size_type sVar17;
  reference __x;
  ulong uVar18;
  const_reference pvVar19;
  FilterCase *this_03;
  reference pvVar20;
  reference pvVar21;
  AsyncCase *pAVar22;
  TestCaseGroup *this_04;
  LabelCase *this_05;
  long lVar23;
  long lVar24;
  int local_124c;
  GLenum local_1248;
  int ndx_2;
  anon_struct_24_3_0e957f36 cases [10];
  TestCaseGroup *labels;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1148;
  undefined1 local_1121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1120;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper> local_10f9;
  undefined1 local_10f8 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  funcs_2;
  string local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b8;
  undefined1 local_1098 [8];
  string name_2;
  int end_2;
  int start_2;
  int caseNdx_2;
  int caseCount_2;
  int maxAsyncCaseCount;
  int errorFuncsPerCase_2;
  TestCaseGroup *async;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>_>
  local_1050;
  const_iterator local_1048;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper> local_1039;
  undefined1 local_1038 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  funcs_1;
  string local_1018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff8;
  string local_fd8 [8];
  string name_1;
  int end_1;
  int start_1;
  int caseNdx_1;
  int caseCount_1;
  int maxFilteringCaseCount_1;
  int errorFuncsPerCase_1;
  TestCaseGroup *groups;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>_>
  local_f90;
  const_iterator local_f88;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper> local_f79;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>_>
  local_f78;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>_>
  local_f70;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>_>
  local_f68;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>_>
  local_f60;
  undefined1 local_f58 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  funcs;
  undefined1 local_f20 [8];
  string name;
  int end;
  int start;
  int caseNdx;
  int caseCount;
  int maxFilteringCaseCount;
  int errorFuncsPerCase;
  TestCaseGroup *filtering;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>_>
  local_ed8;
  ulong local_ed0;
  size_t ndx_1;
  FunctionContainer *local_ec0;
  __normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
  local_eb8;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
  local_eb0;
  const_iterator local_ea8;
  FunctionContainer *local_ea0;
  FunctionContainer *local_e98;
  __normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
  local_e90;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
  local_e88;
  const_iterator local_e80;
  FunctionContainer *local_e78;
  FunctionContainer *local_e70;
  __normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
  local_e68;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
  local_e60;
  const_iterator local_e58;
  undefined1 local_e50 [8];
  Random rng;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  allFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  containers;
  TestCaseGroup *host_3;
  TestCaseGroup *host_2;
  TestCaseGroup *host_1;
  TestCaseGroup *host;
  TestCaseGroup *negative;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc0;
  undefined4 local_d9c;
  char *pcStack_d98;
  QueryType queryType_25;
  char *postfix_25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  undefined4 local_d44;
  char *pcStack_d40;
  QueryType queryType_24;
  char *postfix_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  undefined4 local_cec;
  char *pcStack_ce8;
  QueryType queryType_23;
  char *postfix_23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  undefined4 local_c94;
  char *pcStack_c90;
  QueryType queryType_22;
  char *postfix_22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c60;
  undefined4 local_c3c;
  char *pcStack_c38;
  QueryType queryType_21;
  char *postfix_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  undefined4 local_be4;
  char *pcStack_be0;
  QueryType queryType_20;
  char *postfix_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  undefined4 local_b8c;
  char *pcStack_b88;
  QueryType queryType_19;
  char *postfix_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58;
  undefined4 local_b34;
  char *pcStack_b30;
  QueryType queryType_18;
  char *postfix_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  undefined4 local_adc;
  char *pcStack_ad8;
  QueryType queryType_17;
  char *postfix_17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  undefined4 local_a84;
  char *pcStack_a80;
  QueryType queryType_16;
  char *postfix_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  undefined4 local_a2c;
  char *pcStack_a28;
  QueryType queryType_15;
  char *postfix_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  undefined4 local_9d4;
  char *pcStack_9d0;
  QueryType queryType_14;
  char *postfix_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  undefined4 local_97c;
  char *pcStack_978;
  QueryType queryType_13;
  char *postfix_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  undefined4 local_924;
  char *pcStack_920;
  QueryType queryType_12;
  char *postfix_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  undefined4 local_8cc;
  char *pcStack_8c8;
  QueryType queryType_11;
  char *postfix_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  undefined4 local_874;
  char *pcStack_870;
  QueryType queryType_10;
  char *postfix_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  undefined4 local_81c;
  char *pcStack_818;
  QueryType queryType_9;
  char *postfix_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  undefined4 local_7c4;
  char *pcStack_7c0;
  QueryType queryType_8;
  char *postfix_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  undefined4 local_76c;
  char *pcStack_768;
  QueryType queryType_7;
  char *postfix_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  undefined4 local_714;
  char *pcStack_710;
  QueryType queryType_6;
  char *postfix_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  undefined4 local_6bc;
  char *pcStack_6b8;
  QueryType queryType_5;
  char *postfix_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  undefined4 local_664;
  char *pcStack_660;
  QueryType queryType_4;
  char *postfix_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  allocator<char> local_609;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  undefined4 local_5c4;
  char *pcStack_5c0;
  QueryType queryType_3;
  char *postfix_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  allocator<char> local_569;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  undefined4 local_524;
  char *pcStack_520;
  QueryType queryType_2;
  char *postfix_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  allocator<char> local_4c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  undefined4 local_484;
  char *pcStack_480;
  QueryType queryType_1;
  char *postfix_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  allocator<char> local_429;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined4 local_3e4;
  char *pcStack_3e0;
  QueryType queryType;
  char *postfix;
  TestNode *pTStack_3d0;
  int ndx;
  TestCaseGroup *queries;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  externalFuncs;
  undefined1 local_398 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  computeFuncs;
  undefined1 local_368 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderStorageFuncs;
  undefined1 local_338 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  advancedBlendFuncs;
  undefined1 local_308 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  preciseFuncs;
  undefined1 local_2d8 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ssboBlockFuncs;
  undefined1 local_2a8 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderDirectiveFuncs;
  undefined1 local_278 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderFunctionFuncs;
  undefined1 local_248 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageAtomicExchangeFuncs;
  undefined1 local_218 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageAtomicFuncs;
  undefined1 local_1e8 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageStoreFuncs;
  undefined1 local_1b8 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageLoadFuncs;
  undefined1 local_188 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  atomicCounterFuncs;
  undefined1 local_158 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  tessellationFuncs;
  undefined1 local_128 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  stateFuncs;
  undefined1 local_f8 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  vaFuncs;
  undefined1 local_c8 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  fragmentFuncs;
  undefined1 local_98 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderFuncs;
  undefined1 local_68 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  textureFuncs;
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  local_40;
  undefined1 local_28 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  bufferFuncs;
  DebugTests *this_local;
  
  bufferFuncs.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  NegativeTestShared::getNegativeBufferApiTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_28,&local_40);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector(&local_40);
  NegativeTestShared::getNegativeTextureApiTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_68,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&shaderFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&shaderFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeShaderApiTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_98,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&fragmentFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&fragmentFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeFragmentApiTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_c8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&vaFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&vaFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeVertexArrayApiTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_f8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&stateFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&stateFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeStateApiTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_128,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&tessellationFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&tessellationFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeTessellationTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_158,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&atomicCounterFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&atomicCounterFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeAtomicCounterTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_188,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&imageLoadFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&imageLoadFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeShaderImageLoadTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_1b8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&imageStoreFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&imageStoreFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeShaderImageStoreTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_1e8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&imageAtomicFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&imageAtomicFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeShaderImageAtomicTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_218,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&imageAtomicExchangeFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&imageAtomicExchangeFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeShaderImageAtomicExchangeTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_248,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&shaderFunctionFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&shaderFunctionFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeShaderFunctionTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_278,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&shaderDirectiveFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&shaderDirectiveFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeShaderDirectiveTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_2a8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&ssboBlockFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&ssboBlockFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeSSBOBlockTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_2d8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&preciseFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&preciseFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativePreciseTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_308,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&advancedBlendFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&advancedBlendFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeAdvancedBlendEquationTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_338,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&shaderStorageFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&shaderStorageFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeShaderStorageTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_368,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&computeFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&computeFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  NegativeTestShared::getNegativeComputeTestFunctions();
  wrapCoreFunctions((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_398,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&externalFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             *)&externalFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  anon_unknown_1::getUserMessageFuncs();
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "State query");
  pTStack_3d0 = pTVar8;
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  for (postfix._4_4_ = 0; postfix._4_4_ < 4; postfix._4_4_ = postfix._4_4_ + 1) {
    do {
      pTVar8 = pTStack_3d0;
      pcStack_3e0 = "_getboolean";
      local_3e4 = 0;
      pLVar9 = (LimitQueryCase *)operator_new(0x88);
      postfix_1._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar10 = init::limits[postfix._4_4_].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,pcVar10,&local_429);
      std::operator+(&local_408,&local_428,"_getboolean");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"Test ",(allocator<char> *)((long)&postfix_1 + 7));
      std::operator+(&local_450,&local_470,init::limits[postfix._4_4_].targetName);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::LimitQueryCase::LimitQueryCase
                (pLVar9,pCVar3,pcVar10,pcVar11,init::limits[postfix._4_4_].target,
                 init::limits[postfix._4_4_].limit,QUERY_BOOLEAN);
      postfix_1._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_1 + 7));
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_428);
      std::allocator<char>::~allocator(&local_429);
      pTVar8 = pTStack_3d0;
      pcStack_480 = "_getinteger";
      local_484 = 3;
      pLVar9 = (LimitQueryCase *)operator_new(0x88);
      postfix_2._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar10 = init::limits[postfix._4_4_].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,pcVar10,&local_4c9);
      std::operator+(&local_4a8,&local_4c8,"_getinteger");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Test ",(allocator<char> *)((long)&postfix_2 + 7));
      std::operator+(&local_4f0,&local_510,init::limits[postfix._4_4_].targetName);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::LimitQueryCase::LimitQueryCase
                (pLVar9,pCVar3,pcVar10,pcVar11,init::limits[postfix._4_4_].target,
                 init::limits[postfix._4_4_].limit,QUERY_INTEGER);
      postfix_2._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_2 + 7));
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::allocator<char>::~allocator(&local_4c9);
      pTVar8 = pTStack_3d0;
      pcStack_520 = "_getinteger64";
      local_524 = 4;
      pLVar9 = (LimitQueryCase *)operator_new(0x88);
      postfix_3._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar10 = init::limits[postfix._4_4_].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,pcVar10,&local_569);
      std::operator+(&local_548,&local_568,"_getinteger64");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5b0,"Test ",(allocator<char> *)((long)&postfix_3 + 7));
      std::operator+(&local_590,&local_5b0,init::limits[postfix._4_4_].targetName);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::LimitQueryCase::LimitQueryCase
                (pLVar9,pCVar3,pcVar10,pcVar11,init::limits[postfix._4_4_].target,
                 init::limits[postfix._4_4_].limit,QUERY_INTEGER64);
      postfix_3._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_3 + 7));
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_568);
      std::allocator<char>::~allocator(&local_569);
      pTVar8 = pTStack_3d0;
      pcStack_5c0 = "_getfloat";
      local_5c4 = 5;
      pLVar9 = (LimitQueryCase *)operator_new(0x88);
      postfix_4._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar10 = init::limits[postfix._4_4_].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,pcVar10,&local_609);
      std::operator+(&local_5e8,&local_608,"_getfloat");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_650,"Test ",(allocator<char> *)((long)&postfix_4 + 7));
      std::operator+(&local_630,&local_650,init::limits[postfix._4_4_].targetName);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::LimitQueryCase::LimitQueryCase
                (pLVar9,pCVar3,pcVar10,pcVar11,init::limits[postfix._4_4_].target,
                 init::limits[postfix._4_4_].limit,QUERY_FLOAT);
      postfix_4._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_4 + 7));
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string((string *)&local_608);
      std::allocator<char>::~allocator(&local_609);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  do {
    pTVar8 = pTStack_3d0;
    pcStack_660 = "_isenabled";
    local_664 = 2;
    pIVar12 = (IsEnabledCase *)operator_new(0x88);
    postfix_5._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a8,"debug_output",(allocator<char> *)((long)&postfix_5 + 7));
    std::operator+(&local_688,&local_6a8,"_isenabled");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::IsEnabledCase::IsEnabledCase
              (pIVar12,pCVar3,pcVar10,"Test DEBUG_OUTPUT",0x92e0,INITIAL_CTX_IS_DEBUG,
               QUERY_ISENABLED);
    postfix_5._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_5 + 7));
    do {
      pTVar8 = pTStack_3d0;
      pcStack_6b8 = "_getboolean";
      local_6bc = 0;
      pIVar12 = (IsEnabledCase *)operator_new(0x88);
      postfix_6._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,"debug_output",(allocator<char> *)((long)&postfix_6 + 7));
      std::operator+(&local_6e0,&local_700,"_getboolean");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::IsEnabledCase::IsEnabledCase
                (pIVar12,pCVar3,pcVar10,"Test DEBUG_OUTPUT",0x92e0,INITIAL_CTX_IS_DEBUG,
                 QUERY_BOOLEAN);
      postfix_6._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_700);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_6 + 7));
      pTVar8 = pTStack_3d0;
      pcStack_710 = "_getinteger";
      local_714 = 3;
      pIVar12 = (IsEnabledCase *)operator_new(0x88);
      postfix_7._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,"debug_output",(allocator<char> *)((long)&postfix_7 + 7));
      std::operator+(&local_738,&local_758,"_getinteger");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::IsEnabledCase::IsEnabledCase
                (pIVar12,pCVar3,pcVar10,"Test DEBUG_OUTPUT",0x92e0,INITIAL_CTX_IS_DEBUG,
                 QUERY_INTEGER);
      postfix_7._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)&local_758);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_7 + 7));
      pTVar8 = pTStack_3d0;
      pcStack_768 = "_getinteger64";
      local_76c = 4;
      pIVar12 = (IsEnabledCase *)operator_new(0x88);
      postfix_8._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7b0,"debug_output",(allocator<char> *)((long)&postfix_8 + 7));
      std::operator+(&local_790,&local_7b0,"_getinteger64");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::IsEnabledCase::IsEnabledCase
                (pIVar12,pCVar3,pcVar10,"Test DEBUG_OUTPUT",0x92e0,INITIAL_CTX_IS_DEBUG,
                 QUERY_INTEGER64);
      postfix_8._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
      std::__cxx11::string::~string((string *)&local_790);
      std::__cxx11::string::~string((string *)&local_7b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_8 + 7));
      pTVar8 = pTStack_3d0;
      pcStack_7c0 = "_getfloat";
      local_7c4 = 5;
      pIVar12 = (IsEnabledCase *)operator_new(0x88);
      postfix_9._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_808,"debug_output",(allocator<char> *)((long)&postfix_9 + 7));
      std::operator+(&local_7e8,&local_808,"_getfloat");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::IsEnabledCase::IsEnabledCase
                (pIVar12,pCVar3,pcVar10,"Test DEBUG_OUTPUT",0x92e0,INITIAL_CTX_IS_DEBUG,QUERY_FLOAT)
      ;
      postfix_9._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_808);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_9 + 7));
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    pTVar8 = pTStack_3d0;
    pcStack_818 = "_isenabled";
    local_81c = 2;
    pIVar12 = (IsEnabledCase *)operator_new(0x88);
    postfix_10._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_860,"debug_output_synchronous",
               (allocator<char> *)((long)&postfix_10 + 7));
    std::operator+(&local_840,&local_860,"_isenabled");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::IsEnabledCase::IsEnabledCase
              (pIVar12,pCVar3,pcVar10,"Test DEBUG_OUTPUT_SYNCHRONOUS",0x8242,INITIAL_FALSE,
               QUERY_ISENABLED);
    postfix_10._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
    std::__cxx11::string::~string((string *)&local_840);
    std::__cxx11::string::~string((string *)&local_860);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_10 + 7));
    do {
      pTVar8 = pTStack_3d0;
      pcStack_870 = "_getboolean";
      local_874 = 0;
      pIVar12 = (IsEnabledCase *)operator_new(0x88);
      postfix_11._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8b8,"debug_output_synchronous",
                 (allocator<char> *)((long)&postfix_11 + 7));
      std::operator+(&local_898,&local_8b8,"_getboolean");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::IsEnabledCase::IsEnabledCase
                (pIVar12,pCVar3,pcVar10,"Test DEBUG_OUTPUT_SYNCHRONOUS",0x8242,INITIAL_FALSE,
                 QUERY_BOOLEAN);
      postfix_11._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_11 + 7));
      pTVar8 = pTStack_3d0;
      pcStack_8c8 = "_getinteger";
      local_8cc = 3;
      pIVar12 = (IsEnabledCase *)operator_new(0x88);
      postfix_12._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_910,"debug_output_synchronous",
                 (allocator<char> *)((long)&postfix_12 + 7));
      std::operator+(&local_8f0,&local_910,"_getinteger");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::IsEnabledCase::IsEnabledCase
                (pIVar12,pCVar3,pcVar10,"Test DEBUG_OUTPUT_SYNCHRONOUS",0x8242,INITIAL_FALSE,
                 QUERY_INTEGER);
      postfix_12._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
      std::__cxx11::string::~string((string *)&local_8f0);
      std::__cxx11::string::~string((string *)&local_910);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_12 + 7));
      pTVar8 = pTStack_3d0;
      pcStack_920 = "_getinteger64";
      local_924 = 4;
      pIVar12 = (IsEnabledCase *)operator_new(0x88);
      postfix_13._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_968,"debug_output_synchronous",
                 (allocator<char> *)((long)&postfix_13 + 7));
      std::operator+(&local_948,&local_968,"_getinteger64");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::IsEnabledCase::IsEnabledCase
                (pIVar12,pCVar3,pcVar10,"Test DEBUG_OUTPUT_SYNCHRONOUS",0x8242,INITIAL_FALSE,
                 QUERY_INTEGER64);
      postfix_13._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
      std::__cxx11::string::~string((string *)&local_948);
      std::__cxx11::string::~string((string *)&local_968);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_13 + 7));
      pTVar8 = pTStack_3d0;
      pcStack_978 = "_getfloat";
      local_97c = 5;
      pIVar12 = (IsEnabledCase *)operator_new(0x88);
      postfix_14._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9c0,"debug_output_synchronous",
                 (allocator<char> *)((long)&postfix_14 + 7));
      std::operator+(&local_9a0,&local_9c0,"_getfloat");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::IsEnabledCase::IsEnabledCase
                (pIVar12,pCVar3,pcVar10,"Test DEBUG_OUTPUT_SYNCHRONOUS",0x8242,INITIAL_FALSE,
                 QUERY_FLOAT);
      postfix_14._6_1_ = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
      std::__cxx11::string::~string((string *)&local_9a0);
      std::__cxx11::string::~string((string *)&local_9c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_14 + 7));
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    pTVar8 = pTStack_3d0;
    pcStack_9d0 = "_getboolean";
    local_9d4 = 0;
    pPVar13 = (PositiveIntegerCase *)operator_new(0x80);
    postfix_15._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a18,"debug_logged_messages",
               (allocator<char> *)((long)&postfix_15 + 7));
    std::operator+(&local_9f8,&local_a18,"_getboolean");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
              (pPVar13,pCVar3,pcVar10,"Test DEBUG_LOGGED_MESSAGES",0x9145,QUERY_BOOLEAN);
    postfix_15._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar13);
    std::__cxx11::string::~string((string *)&local_9f8);
    std::__cxx11::string::~string((string *)&local_a18);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_15 + 7));
    pTVar8 = pTStack_3d0;
    pcStack_a28 = "_getinteger";
    local_a2c = 3;
    pPVar13 = (PositiveIntegerCase *)operator_new(0x80);
    postfix_16._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a70,"debug_logged_messages",
               (allocator<char> *)((long)&postfix_16 + 7));
    std::operator+(&local_a50,&local_a70,"_getinteger");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
              (pPVar13,pCVar3,pcVar10,"Test DEBUG_LOGGED_MESSAGES",0x9145,QUERY_INTEGER);
    postfix_16._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar13);
    std::__cxx11::string::~string((string *)&local_a50);
    std::__cxx11::string::~string((string *)&local_a70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_16 + 7));
    pTVar8 = pTStack_3d0;
    pcStack_a80 = "_getinteger64";
    local_a84 = 4;
    pPVar13 = (PositiveIntegerCase *)operator_new(0x80);
    postfix_17._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ac8,"debug_logged_messages",
               (allocator<char> *)((long)&postfix_17 + 7));
    std::operator+(&local_aa8,&local_ac8,"_getinteger64");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
              (pPVar13,pCVar3,pcVar10,"Test DEBUG_LOGGED_MESSAGES",0x9145,QUERY_INTEGER64);
    postfix_17._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar13);
    std::__cxx11::string::~string((string *)&local_aa8);
    std::__cxx11::string::~string((string *)&local_ac8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_17 + 7));
    pTVar8 = pTStack_3d0;
    pcStack_ad8 = "_getfloat";
    local_adc = 5;
    pPVar13 = (PositiveIntegerCase *)operator_new(0x80);
    postfix_18._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b20,"debug_logged_messages",
               (allocator<char> *)((long)&postfix_18 + 7));
    std::operator+(&local_b00,&local_b20,"_getfloat");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
              (pPVar13,pCVar3,pcVar10,"Test DEBUG_LOGGED_MESSAGES",0x9145,QUERY_FLOAT);
    postfix_18._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar13);
    std::__cxx11::string::~string((string *)&local_b00);
    std::__cxx11::string::~string((string *)&local_b20);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_18 + 7));
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    pTVar8 = pTStack_3d0;
    pcStack_b30 = "_getboolean";
    local_b34 = 0;
    pPVar13 = (PositiveIntegerCase *)operator_new(0x80);
    postfix_19._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b78,"debug_next_logged_message_length",
               (allocator<char> *)((long)&postfix_19 + 7));
    std::operator+(&local_b58,&local_b78,"_getboolean");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
              (pPVar13,pCVar3,pcVar10,"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",0x8243,QUERY_BOOLEAN);
    postfix_19._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar13);
    std::__cxx11::string::~string((string *)&local_b58);
    std::__cxx11::string::~string((string *)&local_b78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_19 + 7));
    pTVar8 = pTStack_3d0;
    pcStack_b88 = "_getinteger";
    local_b8c = 3;
    pPVar13 = (PositiveIntegerCase *)operator_new(0x80);
    postfix_20._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bd0,"debug_next_logged_message_length",
               (allocator<char> *)((long)&postfix_20 + 7));
    std::operator+(&local_bb0,&local_bd0,"_getinteger");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
              (pPVar13,pCVar3,pcVar10,"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",0x8243,QUERY_INTEGER);
    postfix_20._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar13);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::~string((string *)&local_bd0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_20 + 7));
    pTVar8 = pTStack_3d0;
    pcStack_be0 = "_getinteger64";
    local_be4 = 4;
    pPVar13 = (PositiveIntegerCase *)operator_new(0x80);
    postfix_21._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c28,"debug_next_logged_message_length",
               (allocator<char> *)((long)&postfix_21 + 7));
    std::operator+(&local_c08,&local_c28,"_getinteger64");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
              (pPVar13,pCVar3,pcVar10,"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",0x8243,QUERY_INTEGER64
              );
    postfix_21._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar13);
    std::__cxx11::string::~string((string *)&local_c08);
    std::__cxx11::string::~string((string *)&local_c28);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_21 + 7));
    pTVar8 = pTStack_3d0;
    pcStack_c38 = "_getfloat";
    local_c3c = 5;
    pPVar13 = (PositiveIntegerCase *)operator_new(0x80);
    postfix_22._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c80,"debug_next_logged_message_length",
               (allocator<char> *)((long)&postfix_22 + 7));
    std::operator+(&local_c60,&local_c80,"_getfloat");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
              (pPVar13,pCVar3,pcVar10,"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",0x8243,QUERY_FLOAT);
    postfix_22._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar13);
    std::__cxx11::string::~string((string *)&local_c60);
    std::__cxx11::string::~string((string *)&local_c80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_22 + 7));
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    pTVar8 = pTStack_3d0;
    pcStack_c90 = "_getboolean";
    local_c94 = 0;
    pGVar14 = (GroupStackDepthQueryCase *)operator_new(0x80);
    postfix_23._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cd8,"debug_group_stack_depth",
               (allocator<char> *)((long)&postfix_23 + 7));
    std::operator+(&local_cb8,&local_cd8,"_getboolean");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::GroupStackDepthQueryCase::GroupStackDepthQueryCase
              (pGVar14,pCVar3,pcVar10,"Test DEBUG_GROUP_STACK_DEPTH",QUERY_BOOLEAN);
    postfix_23._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar14);
    std::__cxx11::string::~string((string *)&local_cb8);
    std::__cxx11::string::~string((string *)&local_cd8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_23 + 7));
    pTVar8 = pTStack_3d0;
    pcStack_ce8 = "_getinteger";
    local_cec = 3;
    pGVar14 = (GroupStackDepthQueryCase *)operator_new(0x80);
    postfix_24._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d30,"debug_group_stack_depth",
               (allocator<char> *)((long)&postfix_24 + 7));
    std::operator+(&local_d10,&local_d30,"_getinteger");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::GroupStackDepthQueryCase::GroupStackDepthQueryCase
              (pGVar14,pCVar3,pcVar10,"Test DEBUG_GROUP_STACK_DEPTH",QUERY_INTEGER);
    postfix_24._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar14);
    std::__cxx11::string::~string((string *)&local_d10);
    std::__cxx11::string::~string((string *)&local_d30);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_24 + 7));
    pTVar8 = pTStack_3d0;
    pcStack_d40 = "_getinteger64";
    local_d44 = 4;
    pGVar14 = (GroupStackDepthQueryCase *)operator_new(0x80);
    postfix_25._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d88,"debug_group_stack_depth",
               (allocator<char> *)((long)&postfix_25 + 7));
    std::operator+(&local_d68,&local_d88,"_getinteger64");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::GroupStackDepthQueryCase::GroupStackDepthQueryCase
              (pGVar14,pCVar3,pcVar10,"Test DEBUG_GROUP_STACK_DEPTH",QUERY_INTEGER64);
    postfix_25._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar14);
    std::__cxx11::string::~string((string *)&local_d68);
    std::__cxx11::string::~string((string *)&local_d88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&postfix_25 + 7));
    pTVar8 = pTStack_3d0;
    pcStack_d98 = "_getfloat";
    local_d9c = 5;
    pGVar14 = (GroupStackDepthQueryCase *)operator_new(0x80);
    negative._6_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_de0,"debug_group_stack_depth",
               (allocator<char> *)((long)&negative + 7));
    std::operator+(&local_dc0,&local_de0,"_getfloat");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::GroupStackDepthQueryCase::GroupStackDepthQueryCase
              (pGVar14,pCVar3,pcVar10,"Test DEBUG_GROUP_STACK_DEPTH",QUERY_FLOAT);
    negative._6_1_ = 0;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar14);
    std::__cxx11::string::~string((string *)&local_dc0);
    std::__cxx11::string::~string((string *)&local_de0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&negative + 7));
    dVar4 = ::deGetFalse();
    pTVar8 = pTStack_3d0;
  } while (dVar4 != 0);
  pTVar15 = (TestNode *)operator_new(0x78);
  anon_unknown_1::DebugCallbackFunctionCase::DebugCallbackFunctionCase
            ((DebugCallbackFunctionCase *)pTVar15,(this->super_TestCaseGroup).m_context,
             "debug_callback_function_getpointer","Test DEBUG_CALLBACK_FUNCTION");
  tcu::TestNode::addChild(pTVar8,pTVar15);
  pTVar8 = pTStack_3d0;
  pTVar15 = (TestNode *)operator_new(0x78);
  anon_unknown_1::DebugCallbackUserParamCase::DebugCallbackUserParamCase
            ((DebugCallbackUserParamCase *)pTVar15,(this->super_TestCaseGroup).m_context,
             "debug_callback_user_param_getpointer","Test DEBUG_CALLBACK_USER_PARAM");
  tcu::TestNode::addChild(pTVar8,pTVar15);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "negative_coverage","API error coverage with various reporting methods");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  pTVar15 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"callbacks",
             "Reporting of standard API errors via callback");
  tcu::TestNode::addChild(pTVar8,pTVar15);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"buffer",
                              "Negative Buffer API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_28)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"texture",
                              "Negative Texture API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_68)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"shader",
                              "Negative Shader API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_98)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"fragment",
                              "Negative Fragment API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_c8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"vertex_array"
                              ,"Negative Vertex Array API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_f8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"state",
                              "Negative GL State API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_128)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "atomic_counter","Negative Atomic Counter API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_188)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_load","Negative Shader Image Load API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_1b8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_store","Negative Shader Image Store API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_1e8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_atomic","Negative Shader Image Atomic API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_218)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_exchange",
                              "Negative Shader Image Atomic Exchange API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_248)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_function","Negative Shader Function Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_278)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_directive","Negative Shader Directive Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_2a8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"ssbo_block",
                              "Negative SSBO Block Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_2d8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"precise",
                              "Negative Precise Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_308)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "advanced_blend","Negative Advanced Blend Equation Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_338)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_storage","Negative Shader Storage Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_368)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"tessellation"
                              ,"Negative Tessellation Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_158)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"compute",
                              "Negative Compute Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_398)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar15 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"log",
             "Reporting of standard API errors via log");
  tcu::TestNode::addChild(pTVar8,pTVar15);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"buffer",
                              "Negative Buffer API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_28)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"texture",
                              "Negative Texture API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_68)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader",
                              "Negative Shader API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_98)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"fragment",
                              "Negative Fragment API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_c8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"vertex_array",
                              "Negative Vertex Array API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_f8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"state",
                              "Negative GL State API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_128)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"atomic_counter",
                              "Negative Atomic Counter API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_188)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_image_load"
                              ,"Negative Shader Image Load API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_1b8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,
                              "shader_image_store","Negative Shader Image Store API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_1e8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,
                              "shader_image_atomic","Negative Shader Image Atomic API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_218)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,
                              "shader_image_exchange",
                              "Negative Shader Image Atomic Exchange API Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_248)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_function",
                              "Negative Shader Function Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_278)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_directive",
                              "Negative Shader Directive Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_2a8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"ssbo_block",
                              "Negative SSBO Block Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_2d8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"precise",
                              "Negative Precise Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_308)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"advanced_blend",
                              "Negative Advanced Blend Equation Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_338)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_storage",
                              "Negative Shader Storage Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_368)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"tessellation",
                              "Negative Tessellation Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_158)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar16 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"compute",
                              "Negative Compute Cases",
                              (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                               *)local_398)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar16);
  pTVar15 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"get_error",
             "Reporting of standard API errors via glGetError");
  tcu::TestNode::addChild(pTVar8,pTVar15);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"buffer",
                             "Negative Buffer API Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_28)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"texture",
                             "Negative Texture API Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_68)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"shader",
                             "Negative Shader API Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_98)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"fragment",
                             "Negative Fragment API Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_c8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"vertex_array",
                             "Negative Vertex Array API Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_f8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"state",
                             "Negative GL State API Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_128)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "atomic_counter","Negative Atomic Counter API Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_188)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_image_load","Negative Shader Image Load API Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_1b8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_image_store","Negative Shader Image Store API Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_1e8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_image_atomic","Negative Shader Image Atomic API Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_218)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_image_exchange",
                             "Negative Shader Image Atomic Exchange API Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_248)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_function","Negative Shader Function Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_278)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_directive","Negative Shader Directive Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_2a8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"ssbo_block",
                             "Negative SSBO Block Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_2d8)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"precise",
                             "Negative Precise Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_308)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "advanced_blend","Negative Advanced Blend Equation Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_338)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_storage","Negative Shader Storage Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_368)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"tessellation",
                             "Negative Tessellation Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_158)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"compute",
                             "Negative Compute Cases",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)local_398)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar8);
  pTVar8 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                             "externally_generated","Externally Generated Messages",
                             (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              *)&queries)->super_TestNode;
  this_00 = (GroupCase *)operator_new(0xf8);
  anon_unknown_1::GroupCase::GroupCase
            (this_00,(this->super_TestCaseGroup).m_context,"push_pop_consistency",
             "Push/pop message generation with full message output checking");
  tcu::TestNode::addChild(pTVar8,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
            *)&allFuncs.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
            *)&rng.m_rnd.z);
  this_01 = gles31::Context::getTestContext((this->super_TestCaseGroup).m_context);
  this_02 = tcu::TestContext::getCommandLine(this_01);
  uVar5 = tcu::CommandLine::getBaseSeed(this_02);
  de::Random::Random((Random *)local_e50,uVar5 ^ 0x53941903);
  ppTVar1 = &allFuncs.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_e60._M_current =
       (FunctionContainer *)
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ::end((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
              *)ppTVar1);
  __gnu_cxx::
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>
  ::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer*>
            ((__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>
              *)&local_e58,&local_e60);
  local_e68._M_current =
       (FunctionContainer *)
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ::begin((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                *)local_28);
  local_e70 = (FunctionContainer *)
              std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
              ::end((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_28);
  local_e78 = (FunctionContainer *)
              std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
              ::
              insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
                        ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
                          *)ppTVar1,local_e58,local_e68,
                         (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
                          )local_e70);
  ppTVar1 = &allFuncs.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_e88._M_current =
       (FunctionContainer *)
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ::end((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
              *)ppTVar1);
  __gnu_cxx::
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>
  ::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer*>
            ((__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>
              *)&local_e80,&local_e88);
  local_e90._M_current =
       (FunctionContainer *)
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ::begin((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                *)local_68);
  local_e98 = (FunctionContainer *)
              std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
              ::end((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)local_68);
  local_ea0 = (FunctionContainer *)
              std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
              ::
              insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
                        ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
                          *)ppTVar1,local_e80,local_e90,
                         (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
                          )local_e98);
  ppTVar1 = &allFuncs.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_eb0._M_current =
       (FunctionContainer *)
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ::end((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
              *)ppTVar1);
  __gnu_cxx::
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>
  ::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer*>
            ((__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>
              *)&local_ea8,&local_eb0);
  local_eb8._M_current =
       (FunctionContainer *)
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ::begin((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                *)&queries);
  local_ec0 = (FunctionContainer *)
              std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
              ::end((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)&queries);
  ndx_1 = (size_t)std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
                  ::
                  insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
                            ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
                              *)ppTVar1,local_ea8,local_eb8,
                             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
                              )local_ec0);
  for (local_ed0 = 0; uVar18 = local_ed0,
      sVar17 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                       *)&allFuncs.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar18 < sVar17;
      local_ed0 = local_ed0 + 1) {
    __x = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
          ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        *)&allFuncs.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,local_ed0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                 *)&rng.m_rnd.z,&__x->function);
  }
  pdVar2 = &rng.m_rnd.z;
  local_ed8._M_current =
       (TestFunctionWrapper *)
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
       ::begin((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                *)pdVar2);
  filtering = (TestCaseGroup *)
              std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
              ::end((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                     *)pdVar2);
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>>>
            ((Random *)local_e50,local_ed8,
             (__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>_>
              )filtering);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "error_filters","Filtering of reported errors");
  caseCount = 4;
  caseNdx = 0x20;
  _maxFilteringCaseCount = pTVar8;
  sVar17 = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
           ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                   *)&rng.m_rnd.z);
  iVar6 = (int)sVar17 + 3;
  if (iVar6 < 0) {
    iVar6 = (int)sVar17 + 6;
  }
  start = iVar6 >> 2;
  tcu::TestNode::addChild((TestNode *)this,_maxFilteringCaseCount);
  for (end = 0; iVar6 = end, iVar7 = de::min<int>(start,0x20), iVar6 < iVar7; end = end + 1) {
    name.field_2._12_4_ = end << 2;
    iVar6 = end * 4;
    sVar17 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
             ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                     *)&rng.m_rnd.z);
    name.field_2._8_4_ = de::min<int>(iVar6 + 4,(int)sVar17);
    de::toString<int>((string *)
                      &funcs.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&end);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f20,
                   "case_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &funcs.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &funcs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pdVar2 = &rng.m_rnd.z;
    local_f68._M_current =
         (TestFunctionWrapper *)
         std::
         vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
         ::begin((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                  *)pdVar2);
    local_f60 = __gnu_cxx::
                __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>_>
                ::operator+(&local_f68,(long)(int)name.field_2._12_4_);
    local_f78._M_current =
         (TestFunctionWrapper *)
         std::
         vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
         ::begin((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                  *)pdVar2);
    local_f70 = __gnu_cxx::
                __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>_>
                ::operator+(&local_f78,(long)(int)name.field_2._8_4_);
    std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>::allocator
              (&local_f79);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
    ::
    vector<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>>,void>
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                *)local_f58,local_f60,local_f70,&local_f79);
    std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>::~allocator
              (&local_f79);
    local_f90._M_current =
         (TestFunctionWrapper *)
         std::
         vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
         ::end((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                *)local_f58);
    __gnu_cxx::
    __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>>
    ::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*>
              ((__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>>
                *)&local_f88,&local_f90);
    uVar18 = (ulong)end;
    sVar17 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)&queries);
    pvVar19 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                            *)&queries,uVar18 % sVar17);
    groups = (TestCaseGroup *)
             std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
             ::insert((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                       *)local_f58,local_f88,&pvVar19->function);
    pTVar8 = _maxFilteringCaseCount;
    this_03 = (FilterCase *)operator_new(0xe8);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::FilterCase::FilterCase
              (this_03,pCVar3,pcVar10,"DebugMessageControl usage",
               (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                *)local_f58);
    tcu::TestNode::addChild(pTVar8,(TestNode *)this_03);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
               *)local_f58);
    std::__cxx11::string::~string((string *)local_f20);
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"error_groups"
             ,"Filtering of reported errors with use of Error Groups");
  caseCount_1 = 4;
  caseNdx_1 = 0x10;
  _maxFilteringCaseCount_1 = pTVar8;
  sVar17 = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
           ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                   *)&rng.m_rnd.z);
  iVar6 = (int)sVar17 + 3;
  if (iVar6 < 0) {
    iVar6 = (int)sVar17 + 6;
  }
  start_1 = iVar6 >> 2;
  tcu::TestNode::addChild((TestNode *)this,_maxFilteringCaseCount_1);
  for (end_1 = 0; end_1 < start_1 && end_1 < 0x10; end_1 = end_1 + 1) {
    name_1.field_2._12_4_ = end_1 << 2;
    iVar6 = end_1 * 4;
    sVar17 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
             ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                     *)&rng.m_rnd.z);
    name_1.field_2._8_4_ = de::min<int>(iVar6 + 4,(int)sVar17);
    de::toString<int>(&local_1018,&end_1);
    std::operator+(&local_ff8,"case_",&local_1018);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_fd8,pcVar10,
               (allocator<char> *)
               ((long)&funcs_1.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&funcs_1.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_ff8);
    std::__cxx11::string::~string((string *)&local_1018);
    pdVar2 = &rng.m_rnd.z;
    pvVar20 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                            *)pdVar2,0);
    lVar23 = (long)(int)name_1.field_2._12_4_;
    pvVar21 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                            *)pdVar2,0);
    lVar24 = (long)(int)name_1.field_2._8_4_;
    std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>::allocator
              (&local_1039);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
    ::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*,void>
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                *)local_1038,pvVar20 + lVar23,pvVar21 + lVar24,&local_1039);
    std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>::~allocator
              (&local_1039);
    local_1050._M_current =
         (TestFunctionWrapper *)
         std::
         vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
         ::end((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                *)local_1038);
    __gnu_cxx::
    __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>>
    ::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*>
              ((__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>>
                *)&local_1048,&local_1050);
    uVar18 = (ulong)end_1;
    sVar17 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)&queries);
    pvVar19 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                            *)&queries,uVar18 % sVar17);
    async = (TestCaseGroup *)
            std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
            ::insert((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                      *)local_1038,local_1048,&pvVar19->function);
    pTVar8 = _maxFilteringCaseCount_1;
    pTVar15 = (TestNode *)operator_new(0xe8);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::GroupFilterCase::GroupFilterCase
              ((GroupFilterCase *)pTVar15,pCVar3,pcVar10,"Debug Group usage",
               (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                *)local_1038);
    tcu::TestNode::addChild(pTVar8,pTVar15);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
               *)local_1038);
    std::__cxx11::string::~string(local_fd8);
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"async",
             "Asynchronous message generation");
  caseCount_2 = 2;
  caseNdx_2 = 0x10;
  _maxAsyncCaseCount = pTVar8;
  sVar17 = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
           ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                   *)&rng.m_rnd.z);
  start_2 = ((int)sVar17 + 1) - ((int)sVar17 + 1 >> 0x1f) >> 1;
  tcu::TestNode::addChild((TestNode *)this,_maxAsyncCaseCount);
  for (end_2 = 0; end_2 < start_2 && end_2 < 0x10; end_2 = end_2 + 1) {
    name_2.field_2._12_4_ = end_2 * 2;
    iVar6 = end_2 * 2;
    sVar17 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
             ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                     *)&rng.m_rnd.z);
    name_2.field_2._8_4_ = de::min<int>(iVar6 + 2,(int)sVar17);
    de::toString<int>(&local_10d8,&end_2);
    std::operator+(&local_10b8,"case_",&local_10d8);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1098,pcVar10,
               (allocator<char> *)
               ((long)&funcs_2.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&funcs_2.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_10b8);
    std::__cxx11::string::~string((string *)&local_10d8);
    pdVar2 = &rng.m_rnd.z;
    pvVar20 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                            *)pdVar2,0);
    lVar23 = (long)(int)name_2.field_2._12_4_;
    pvVar21 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                            *)pdVar2,0);
    lVar24 = (long)(int)name_2.field_2._8_4_;
    std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>::allocator
              (&local_10f9);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
    ::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*,void>
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                *)local_10f8,pvVar20 + lVar23,pvVar21 + lVar24,&local_10f9);
    std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>::~allocator
              (&local_10f9);
    pTVar8 = _maxAsyncCaseCount;
    if ((end_2 & 1U) == 0) {
      pAVar22 = (AsyncCase *)operator_new(0x120);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1098
                     ,"_log");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::AsyncCase::AsyncCase
                (pAVar22,pCVar3,pcVar10,"Async message generation",
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                  *)local_10f8,false);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pAVar22);
      std::__cxx11::string::~string((string *)&local_1148);
    }
    else {
      pAVar22 = (AsyncCase *)operator_new(0x120);
      local_1121 = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1098
                     ,"_callback");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::AsyncCase::AsyncCase
                (pAVar22,pCVar3,pcVar10,"Async message generation",
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                  *)local_10f8,true);
      local_1121 = 0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pAVar22);
      std::__cxx11::string::~string((string *)&local_1120);
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
               *)local_10f8);
    std::__cxx11::string::~string((string *)local_1098);
  }
  de::Random::~Random((Random *)local_e50);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
             *)&rng.m_rnd.z);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)&allFuncs.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_04 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (this_04,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "object_labels","Labeling objects");
  cases[9].desc = (char *)this_04;
  memcpy(&local_1248,&DAT_032abb10,0xf0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)cases[9].desc);
  pcVar10 = cases[9].desc;
  pTVar8 = (TestNode *)operator_new(0x78);
  anon_unknown_1::InitialLabelCase::InitialLabelCase
            ((InitialLabelCase *)pTVar8,(this->super_TestCaseGroup).m_context,"initial",
             "Debug label initial value");
  tcu::TestNode::addChild((TestNode *)pcVar10,pTVar8);
  pcVar10 = cases[9].desc;
  pTVar8 = (TestNode *)operator_new(0x78);
  anon_unknown_1::ClearLabelCase::ClearLabelCase
            ((ClearLabelCase *)pTVar8,(this->super_TestCaseGroup).m_context,"clearing",
             "Debug label clearing");
  tcu::TestNode::addChild((TestNode *)pcVar10,pTVar8);
  pcVar10 = cases[9].desc;
  pTVar8 = (TestNode *)operator_new(0x78);
  anon_unknown_1::SpecifyWithLengthCase::SpecifyWithLengthCase
            ((SpecifyWithLengthCase *)pTVar8,(this->super_TestCaseGroup).m_context,
             "specify_with_length","Debug label specified with length");
  tcu::TestNode::addChild((TestNode *)pcVar10,pTVar8);
  pcVar10 = cases[9].desc;
  pTVar8 = (TestNode *)operator_new(0x78);
  anon_unknown_1::BufferLimitedLabelCase::BufferLimitedLabelCase
            ((BufferLimitedLabelCase *)pTVar8,(this->super_TestCaseGroup).m_context,
             "buffer_limited_query","Debug label query to too short buffer");
  tcu::TestNode::addChild((TestNode *)pcVar10,pTVar8);
  pcVar10 = cases[9].desc;
  pTVar8 = (TestNode *)operator_new(0x78);
  anon_unknown_1::LabelMaxSizeCase::LabelMaxSizeCase
            ((LabelMaxSizeCase *)pTVar8,(this->super_TestCaseGroup).m_context,"max_label_length",
             "Max sized debug label");
  tcu::TestNode::addChild((TestNode *)pcVar10,pTVar8);
  pcVar10 = cases[9].desc;
  pTVar8 = (TestNode *)operator_new(0x78);
  anon_unknown_1::LabelLengthCase::LabelLengthCase
            ((LabelLengthCase *)pTVar8,(this->super_TestCaseGroup).m_context,"query_length_only",
             "Query debug label length");
  tcu::TestNode::addChild((TestNode *)pcVar10,pTVar8);
  for (local_124c = 0; pcVar10 = cases[9].desc, local_124c < 10; local_124c = local_124c + 1) {
    this_05 = (LabelCase *)operator_new(0x80);
    lVar23 = (long)local_124c;
    anon_unknown_1::LabelCase::LabelCase
              (this_05,(this->super_TestCaseGroup).m_context,*(char **)(cases + lVar23),
               cases[lVar23].name,(&local_1248)[lVar23 * 6]);
    tcu::TestNode::addChild((TestNode *)pcVar10,(TestNode *)this_05);
  }
  pTVar8 = (TestNode *)operator_new(0x78);
  anon_unknown_1::SyncLabelCase::SyncLabelCase
            ((SyncLabelCase *)pTVar8,(this->super_TestCaseGroup).m_context,"sync",
             "Debug label on a sync object");
  tcu::TestNode::addChild((TestNode *)pcVar10,pTVar8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)&queries);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_398);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_368);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_338);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_308);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_2d8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_2a8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_278);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_248);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_218);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_1e8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_1b8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_188);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_158);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_128);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_f8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_c8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_98);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_68);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *)local_28);
  return extraout_EAX;
}

Assistant:

void DebugTests::init (void)
{
	const vector<FunctionContainer> bufferFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeBufferApiTestFunctions());
	const vector<FunctionContainer> textureFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeTextureApiTestFunctions());
	const vector<FunctionContainer> shaderFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderApiTestFunctions());
	const vector<FunctionContainer> fragmentFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeFragmentApiTestFunctions());
	const vector<FunctionContainer> vaFuncs					 = wrapCoreFunctions(NegativeTestShared::getNegativeVertexArrayApiTestFunctions());
	const vector<FunctionContainer> stateFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeStateApiTestFunctions());
	const vector<FunctionContainer> tessellationFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeTessellationTestFunctions());
	const vector<FunctionContainer> atomicCounterFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeAtomicCounterTestFunctions());
	const vector<FunctionContainer> imageLoadFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageLoadTestFunctions());
	const vector<FunctionContainer> imageStoreFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageStoreTestFunctions());
	const vector<FunctionContainer> imageAtomicFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageAtomicTestFunctions());
	const vector<FunctionContainer> imageAtomicExchangeFuncs = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageAtomicExchangeTestFunctions());
	const vector<FunctionContainer> shaderFunctionFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderFunctionTestFunctions());
	const vector<FunctionContainer> shaderDirectiveFuncs	 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderDirectiveTestFunctions());
	const vector<FunctionContainer> ssboBlockFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeSSBOBlockTestFunctions());
	const vector<FunctionContainer> preciseFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativePreciseTestFunctions());
	const vector<FunctionContainer> advancedBlendFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeAdvancedBlendEquationTestFunctions());
	const vector<FunctionContainer> shaderStorageFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderStorageTestFunctions());
	const vector<FunctionContainer> computeFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeComputeTestFunctions());
	const vector<FunctionContainer> externalFuncs			 = getUserMessageFuncs();

	{
		using namespace gls::StateQueryUtil;

		tcu::TestCaseGroup* const queries = new tcu::TestCaseGroup(m_testCtx, "state_query", "State query");

		static const struct
		{
			const char*	name;
			const char*	targetName;
			glw::GLenum	target;
			int			limit;
		} limits[] =
		{
			{ "max_debug_message_length",		"MAX_DEBUG_MESSAGE_LENGTH",		GL_MAX_DEBUG_MESSAGE_LENGTH,	1	},
			{ "max_debug_logged_messages",		"MAX_DEBUG_LOGGED_MESSAGES",	GL_MAX_DEBUG_LOGGED_MESSAGES,	1	},
			{ "max_debug_group_stack_depth",	"MAX_DEBUG_GROUP_STACK_DEPTH",	GL_MAX_DEBUG_GROUP_STACK_DEPTH,	64	},
			{ "max_label_length",				"MAX_LABEL_LENGTH",				GL_MAX_LABEL_LENGTH,			256	},
		};

		addChild(queries);

		#define FOR_ALL_TYPES(X) \
			do \
			{ \
				{ \
					const char* const	postfix = "_getboolean"; \
					const QueryType		queryType = QUERY_BOOLEAN; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getinteger"; \
					const QueryType		queryType = QUERY_INTEGER; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getinteger64"; \
					const QueryType		queryType = QUERY_INTEGER64; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getfloat"; \
					const QueryType		queryType = QUERY_FLOAT; \
					X; \
				} \
			} \
			while (deGetFalse())
		#define FOR_ALL_ENABLE_TYPES(X) \
			do \
			{ \
				{ \
					const char* const	postfix = "_isenabled"; \
					const QueryType		queryType = QUERY_ISENABLED; \
					X; \
				} \
				FOR_ALL_TYPES(X); \
			} \
			while (deGetFalse())

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(limits); ++ndx)
		{
			FOR_ALL_TYPES(queries->addChild(new LimitQueryCase(m_context,
															   (std::string(limits[ndx].name) + postfix).c_str(),
															   (std::string("Test ") + limits[ndx].targetName).c_str(),
															   limits[ndx].target, limits[ndx].limit, queryType)));
		}

		FOR_ALL_ENABLE_TYPES(queries->addChild(new IsEnabledCase	(m_context, (std::string("debug_output") + postfix).c_str(),						"Test DEBUG_OUTPUT",						GL_DEBUG_OUTPUT,				IsEnabledCase::INITIAL_CTX_IS_DEBUG,	queryType)));
		FOR_ALL_ENABLE_TYPES(queries->addChild(new IsEnabledCase	(m_context, (std::string("debug_output_synchronous") + postfix).c_str(),			"Test DEBUG_OUTPUT_SYNCHRONOUS",			GL_DEBUG_OUTPUT_SYNCHRONOUS,	IsEnabledCase::INITIAL_FALSE,			queryType)));

		FOR_ALL_TYPES(queries->addChild(new PositiveIntegerCase		(m_context, (std::string("debug_logged_messages") + postfix).c_str(),				"Test DEBUG_LOGGED_MESSAGES",				GL_DEBUG_LOGGED_MESSAGES,				queryType)));
		FOR_ALL_TYPES(queries->addChild(new PositiveIntegerCase		(m_context, (std::string("debug_next_logged_message_length") + postfix).c_str(),	"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",	GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH,	queryType)));
		FOR_ALL_TYPES(queries->addChild(new GroupStackDepthQueryCase(m_context, (std::string("debug_group_stack_depth") + postfix).c_str(),				"Test DEBUG_GROUP_STACK_DEPTH",				queryType)));

		queries->addChild(new DebugCallbackFunctionCase	(m_context, "debug_callback_function_getpointer",	"Test DEBUG_CALLBACK_FUNCTION"));
		queries->addChild(new DebugCallbackUserParamCase(m_context, "debug_callback_user_param_getpointer", "Test DEBUG_CALLBACK_USER_PARAM"));

		#undef FOR_ALL_TYPES
		#undef FOR_ALL_ENABLE_TYPES
	}

	{
		tcu::TestCaseGroup* const	negative	= new tcu::TestCaseGroup(m_testCtx, "negative_coverage", "API error coverage with various reporting methods");

		addChild(negative);
		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "callbacks", "Reporting of standard API errors via callback");

			negative->addChild(host);
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "buffer",						"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader",						"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "fragment",					"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "vertex_array",				"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "state",						"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "atomic_counter",				"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_load",			"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_store",			"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_exchange",		"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_directive",			"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "ssbo_block",					"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "advanced_blend",				"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_storage",				"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "tessellation",				"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}

		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "log", "Reporting of standard API errors via log");

			negative->addChild(host);

			host->addChild(createChildCases(CASETYPE_LOG, m_context, "buffer",					"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader",					"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "fragment",				"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "vertex_array",			"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "state",					"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "atomic_counter",			"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_load",		"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_store",		"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_exchange",	"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_directive",		"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "ssbo_block",				"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "advanced_blend",			"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_storage",			"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "tessellation",			"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}

		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "get_error", "Reporting of standard API errors via glGetError");

			negative->addChild(host);

			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "buffer",						"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader",						"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "fragment",					"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "vertex_array",				"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "state",						"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "atomic_counter",				"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_load",			"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_store",			"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_exchange",		"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_directive",			"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "ssbo_block",					"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "advanced_blend",				"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_storage",				"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "tessellation",				"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}
	}

	{
		tcu::TestCaseGroup* const host = createChildCases(CASETYPE_CALLBACK, m_context, "externally_generated", "Externally Generated Messages", externalFuncs);

		host->addChild(new GroupCase(m_context, "push_pop_consistency", "Push/pop message generation with full message output checking"));

		addChild(host);
	}

	{
		vector<FunctionContainer>	containers;
		vector<TestFunctionWrapper>	allFuncs;

		de::Random					rng			(0x53941903 ^ m_context.getTestContext().getCommandLine().getBaseSeed());

		containers.insert(containers.end(), bufferFuncs.begin(), bufferFuncs.end());
		containers.insert(containers.end(), textureFuncs.begin(), textureFuncs.end());
		containers.insert(containers.end(), externalFuncs.begin(), externalFuncs.end());

		for (size_t ndx = 0; ndx < containers.size(); ndx++)
			allFuncs.push_back(containers[ndx].function);

		rng.shuffle(allFuncs.begin(), allFuncs.end());

		{
			tcu::TestCaseGroup* const	filtering				= new tcu::TestCaseGroup(m_testCtx, "error_filters", "Filtering of reported errors");
			const int					errorFuncsPerCase		= 4;
			const int					maxFilteringCaseCount	= 32;
			const int					caseCount				= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(filtering);

			for (int caseNdx = 0; caseNdx < de::min(caseCount, maxFilteringCaseCount); caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= "case_" + de::toString(caseNdx);
				vector<TestFunctionWrapper>	funcs		(allFuncs.begin()+start, allFuncs.begin()+end);

				// These produce lots of different message types, thus always include at least one when testing filtering
				funcs.insert(funcs.end(), externalFuncs[caseNdx%externalFuncs.size()].function);

				filtering->addChild(new FilterCase(m_context, name.c_str(), "DebugMessageControl usage", funcs));
			}
		}

		{
			tcu::TestCaseGroup* const	groups					= new tcu::TestCaseGroup(m_testCtx, "error_groups", "Filtering of reported errors with use of Error Groups");
			const int					errorFuncsPerCase		= 4;
			const int					maxFilteringCaseCount	= 16;
			const int					caseCount				= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(groups);

			for (int caseNdx = 0; caseNdx < caseCount && caseNdx < maxFilteringCaseCount; caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= ("case_" + de::toString(caseNdx)).c_str();
				vector<TestFunctionWrapper>	funcs		(&allFuncs[0]+start, &allFuncs[0]+end);

				// These produce lots of different message types, thus always include at least one when testing filtering
				funcs.insert(funcs.end(), externalFuncs[caseNdx%externalFuncs.size()].function);

				groups->addChild(new GroupFilterCase(m_context, name.c_str(), "Debug Group usage", funcs));
			}
		}

		{
			tcu::TestCaseGroup* const	async				= new tcu::TestCaseGroup(m_testCtx, "async", "Asynchronous message generation");
			const int					errorFuncsPerCase	= 2;
			const int					maxAsyncCaseCount	= 16;
			const int					caseCount			= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(async);

			for (int caseNdx = 0; caseNdx < caseCount && caseNdx < maxAsyncCaseCount; caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= ("case_" + de::toString(caseNdx)).c_str();
				vector<TestFunctionWrapper>	funcs		(&allFuncs[0]+start, &allFuncs[0]+end);

				if (caseNdx&0x1)
					async->addChild(new AsyncCase(m_context, (name+"_callback").c_str(), "Async message generation", funcs, true));
				else
					async->addChild(new AsyncCase(m_context, (name+"_log").c_str(), "Async message generation", funcs, false));
			}
		}
	}

	{
		tcu::TestCaseGroup* const labels = new tcu::TestCaseGroup(m_testCtx, "object_labels", "Labeling objects");

		const struct
		{
			GLenum		identifier;
			const char*	name;
			const char* desc;
		} cases[] =
		{
			{ GL_BUFFER,				"buffer",				"Debug label on a buffer object"				},
			{ GL_SHADER,				"shader",				"Debug label on a shader object"				},
			{ GL_PROGRAM,				"program",				"Debug label on a program object"				},
			{ GL_QUERY,					"query",				"Debug label on a query object"					},
			{ GL_PROGRAM_PIPELINE,		"program_pipeline",		"Debug label on a program pipeline object"		},
			{ GL_TRANSFORM_FEEDBACK,	"transform_feedback",	"Debug label on a transform feedback object"	},
			{ GL_SAMPLER,				"sampler",				"Debug label on a sampler object"				},
			{ GL_TEXTURE,				"texture",				"Debug label on a texture object"				},
			{ GL_RENDERBUFFER,			"renderbuffer",			"Debug label on a renderbuffer object"			},
			{ GL_FRAMEBUFFER,			"framebuffer",			"Debug label on a framebuffer object"			},
		};

		addChild(labels);

		labels->addChild(new InitialLabelCase		(m_context, "initial",				"Debug label initial value"));
		labels->addChild(new ClearLabelCase			(m_context, "clearing",				"Debug label clearing"));
		labels->addChild(new SpecifyWithLengthCase	(m_context, "specify_with_length",	"Debug label specified with length"));
		labels->addChild(new BufferLimitedLabelCase	(m_context, "buffer_limited_query",	"Debug label query to too short buffer"));
		labels->addChild(new LabelMaxSizeCase		(m_context, "max_label_length",		"Max sized debug label"));
		labels->addChild(new LabelLengthCase		(m_context, "query_length_only",	"Query debug label length"));

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
			labels->addChild(new LabelCase(m_context, cases[ndx].name, cases[ndx].desc, cases[ndx].identifier));
		labels->addChild(new SyncLabelCase(m_context, "sync", "Debug label on a sync object"));
	}
}